

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_test.cxx
# Opt level: O1

int raft_server_test::multiple_config_change_test(void)

{
  RaftPkg *pRVar1;
  uint uVar2;
  _func_int **pp_Var3;
  _List_node_base *p_Var4;
  int *piVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  code cVar6;
  int iVar7;
  cmd_result_code cVar8;
  ostream *poVar9;
  pointer psVar10;
  int __how;
  int __how_00;
  int __how_01;
  int __how_02;
  int iVar11;
  int __fd;
  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *configs_out_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  _func_int *p_Var13;
  bool bVar14;
  initializer_list<RaftPkg_*> __l;
  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  configs_out;
  ptr<FakeNetworkBase> f_base;
  ptr<cluster_config> c_conf;
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> pkgs;
  ptr<srv_config> s4_conf;
  ptr<raft_result> ret;
  string s3_addr;
  string s2_addr;
  string s1_addr;
  string s4_addr;
  RaftPkg s1;
  RaftPkg s4;
  RaftPkg s3;
  RaftPkg s2;
  undefined1 local_688 [32];
  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  local_668;
  ptr<FakeNetworkBase> local_648;
  undefined1 local_638 [24];
  thread local_620;
  id local_610;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_608;
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  undefined1 local_560 [72];
  __native_type local_518 [6];
  undefined8 local_418;
  undefined1 local_408 [328];
  undefined1 local_2c0 [328];
  RaftPkg local_178;
  
  configs_out_00 =
       (vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
        *)local_688;
  raft_functional_common::reset_log_files();
  local_648.super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (FakeNetworkBase *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nuraft::FakeNetworkBase,std::allocator<nuraft::FakeNetworkBase>>
            (&local_648.super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(FakeNetworkBase **)&local_648,
             (allocator<nuraft::FakeNetworkBase> *)(local_560 + 0x10));
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"S1","");
  local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"S2","");
  local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_5f0 + 0x10),"S3","");
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"S4","");
  RaftPkg::RaftPkg((RaftPkg *)(local_560 + 0x10),&local_648,1,&local_5a0);
  RaftPkg::RaftPkg(&local_178,&local_648,2,&local_5c0);
  RaftPkg::RaftPkg((RaftPkg *)local_2c0,&local_648,3,(string *)(local_5f0 + 0x10));
  RaftPkg::RaftPkg((RaftPkg *)local_408,&local_648,4,&local_580);
  __l._M_len = 4;
  __l._M_array = (iterator)local_688;
  local_688._0_8_ = (RaftPkg *)(local_560 + 0x10);
  local_688._8_8_ = &local_178;
  local_688._16_8_ = (RaftPkg *)local_2c0;
  local_688._24_8_ = (RaftPkg *)local_408;
  std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>::vector
            ((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)(local_638 + 0x10),__l,
             (allocator_type *)&local_668);
  iVar7 = launch_servers((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)(local_638 + 0x10),
                         (raft_params *)0x0,false);
  if (iVar7 == 0) {
    iVar7 = make_group((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)(local_638 + 0x10));
    if (iVar7 == 0) {
      p_Var12 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2c0._88_8_ + 0x40))->
                  _M_use_count;
      if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
        }
      }
      nuraft::raft_server::remove_srv((raft_server *)local_560,(int)local_418);
      if (local_560._8_8_ != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._8_8_);
      }
      if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
      }
      p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((_List_node_base *)(local_408._88_8_ + 0x40))->_M_prev;
      if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
        }
      }
      nuraft::raft_server::remove_srv((raft_server *)local_5f0,(int)local_418);
      if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
      }
      cVar8 = nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
              ::get_result_code((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
                                 *)local_5f0._0_8_);
      if (cVar8 < OK) {
        p_Var4 = ((_List_node_base *)(local_408._88_8_ + 0x40))->_M_next;
        p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((_List_node_base *)(local_408._88_8_ + 0x40))->_M_prev;
        if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
          }
        }
        nuraft::raft_server::set_priority((raft_server *)local_418,*(int *)&p_Var4->_M_next,10);
        if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
        }
        pRVar1 = (RaftPkg *)(local_688 + 0x10);
        local_688._8_8_ = (pointer)0x0;
        local_688._16_8_ = local_688._16_8_ & 0xffffffffffffff00;
        local_688._0_8_ = pRVar1;
        nuraft::FakeNetwork::execReqResp((FakeNetwork *)local_518[0]._0_8_,(string *)local_688);
        if ((RaftPkg *)local_688._0_8_ != pRVar1) {
          operator_delete((void *)local_688._0_8_);
        }
        local_688._8_8_ = (pointer)0x0;
        local_688._16_8_ = local_688._16_8_ & 0xffffffffffffff00;
        local_688._0_8_ = pRVar1;
        nuraft::FakeNetwork::execReqResp((FakeNetwork *)local_518[0]._0_8_,(string *)local_688);
        if ((RaftPkg *)local_688._0_8_ != pRVar1) {
          operator_delete((void *)local_688._0_8_);
        }
        local_688._8_8_ = (pointer)0x0;
        local_688._16_8_ = local_688._16_8_ & 0xffffffffffffff00;
        local_688._0_8_ = pRVar1;
        nuraft::FakeNetwork::execReqResp((FakeNetwork *)local_518[0]._0_8_,(string *)local_688);
        if ((RaftPkg *)local_688._0_8_ != pRVar1) {
          operator_delete((void *)local_688._0_8_);
        }
        local_688._8_8_ = (RaftPkg *)0x0;
        local_688._16_8_ = local_688._16_8_ & 0xffffffffffffff00;
        local_688._0_8_ = pRVar1;
        nuraft::FakeNetwork::execReqResp((FakeNetwork *)local_518[0]._0_8_,(string *)local_688);
        if ((RaftPkg *)local_688._0_8_ != pRVar1) {
          operator_delete((void *)local_688._0_8_);
        }
        iVar7 = wait_for_sm_exec((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)(local_638 + 0x10)
                                 ,(size_t)configs_out_00);
        __fd = (int)configs_out_00;
        if (iVar7 == 0) {
          local_610 = local_620._M_id._M_thread;
          p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_638._16_8_;
          if ((id)local_638._16_8_ != local_620._M_id._M_thread) {
            do {
              pp_Var3 = p_Var12->_vptr__Sp_counted_base;
              p_Var13 = pp_Var3[0xb];
              piVar5 = *(int **)(p_Var13 + 0x40);
              this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var13 + 0x48);
              if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  this->_M_use_count = this->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  this->_M_use_count = this->_M_use_count + 1;
                }
              }
              iVar7 = *piVar5;
              if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
              }
              iVar11 = 3;
              if (iVar7 != 3) {
                local_668.
                super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_668.
                super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_668.
                super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                configs_out_00 = &local_668;
                nuraft::raft_server::get_srv_config_all((raft_server *)pp_Var3[0x27],configs_out_00)
                ;
                iVar7 = (int)((ulong)((long)local_668.
                                            super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_668.
                                           super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4);
                if (iVar7 == 3) {
                  iVar11 = 4;
                  for (psVar10 = local_668.
                                 super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                      bVar14 = psVar10 !=
                               local_668.
                               super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish, bVar14;
                      psVar10 = psVar10 + 1) {
                    uVar2 = ((psVar10->
                             super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->id_;
                    if ((4 < uVar2) ||
                       (configs_out_00 =
                             (vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                              *)0x16, (0x16U >> (uVar2 & 0x1f) & 1) == 0)) {
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
                      std::ostream::put(-0x68);
                      poVar9 = (ostream *)std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9,"        time: ",0xe);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;30m",7);
                      TestSuite::getTimeString_abi_cxx11_();
                      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                         (poVar9,(char *)local_688._0_8_,local_688._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9,"      thread: ",0xe);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[33m",5);
                      pp_Var3 = poVar9->_vptr_basic_ostream;
                      *(uint *)(&poVar9->field_0x18 + (long)pp_Var3[-3]) =
                           *(uint *)(&poVar9->field_0x18 + (long)pp_Var3[-3]) & 0xffffffb5 | 8;
                      *(undefined8 *)(&poVar9->field_0x10 + (long)pp_Var3[-3]) = 4;
                      p_Var13 = (_func_int *)
                                ((long)&poVar9->_vptr_basic_ostream + (long)pp_Var3[-3]);
                      if ((&poVar9->field_0xe1)[(long)pp_Var3[-3]] == '\0') {
                        cVar6 = (code)std::ios::widen((char)p_Var13);
                        p_Var13[0xe0] = cVar6;
                        p_Var13[0xe1] = (code)0x1;
                      }
                      p_Var13[0xe0] = (code)0x30;
                      local_638._0_8_ = pthread_self();
                      std::_Hash_bytes(local_638,8,0xc70f6907);
                      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                      *(uint *)(&poVar9->field_0x18 + (long)poVar9->_vptr_basic_ostream[-3]) =
                           *(uint *)(&poVar9->field_0x18 + (long)poVar9->_vptr_basic_ostream[-3]) &
                           0xffffffb5 | 2;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9,"          in: ",0xe);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[36m",5);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9,"multiple_config_change_test",0x1b);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"()\x1b[0m",6);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9,"          at: ",0xe);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[32m",5);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                 ,0x6a);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m:",5);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;35m",7);
                      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x321);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9,
                                 "    value of: \x1b[1;34ms_conf->get_id() == 1 || s_conf->get_id() == 2 || s_conf->get_id() == 4\x1b[0m\n"
                                 ,0x61);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9,"    expected: \x1b[1;32m",0x15);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"true",4);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m\n",5);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9,"      actual: \x1b[1;31m",0x15);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"false",5);
                      configs_out_00 =
                           (vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                            *)0x1a741a;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m\n",5);
                      if ((RaftPkg *)local_688._0_8_ != (RaftPkg *)(local_688 + 0x10)) {
                        operator_delete((void *)local_688._0_8_);
                      }
                      iVar11 = 1;
                      TestSuite::failHandler();
                      break;
                    }
                  }
                  if (!bVar14) {
                    nuraft::raft_server::get_config((raft_server *)local_638);
                    configs_out_00 =
                         (vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                          *)local_638._0_8_;
                    nuraft::cluster_config::get_server
                              ((cluster_config *)local_600,(int)local_638._0_8_);
                    iVar7 = *(int *)(local_600._0_8_ + 0x4c);
                    iVar11 = 0;
                    if (iVar7 != 10) {
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
                      std::ostream::put(-0x68);
                      poVar9 = (ostream *)std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9,"        time: ",0xe);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;30m",7);
                      TestSuite::getTimeString_abi_cxx11_();
                      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                         (poVar9,(char *)local_688._0_8_,local_688._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9,"      thread: ",0xe);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[33m",5);
                      pp_Var3 = poVar9->_vptr_basic_ostream;
                      *(uint *)(&poVar9->field_0x18 + (long)pp_Var3[-3]) =
                           *(uint *)(&poVar9->field_0x18 + (long)pp_Var3[-3]) & 0xffffffb5 | 8;
                      *(undefined8 *)(&poVar9->field_0x10 + (long)pp_Var3[-3]) = 4;
                      p_Var13 = (_func_int *)
                                ((long)&poVar9->_vptr_basic_ostream + (long)pp_Var3[-3]);
                      if ((&poVar9->field_0xe1)[(long)pp_Var3[-3]] == '\0') {
                        cVar6 = (code)std::ios::widen((char)p_Var13);
                        p_Var13[0xe0] = cVar6;
                        p_Var13[0xe1] = (code)0x1;
                      }
                      p_Var13[0xe0] = (code)0x30;
                      local_608._M_pi =
                           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pthread_self();
                      std::_Hash_bytes(&local_608,8,0xc70f6907);
                      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                      *(uint *)(&poVar9->field_0x18 + (long)poVar9->_vptr_basic_ostream[-3]) =
                           *(uint *)(&poVar9->field_0x18 + (long)poVar9->_vptr_basic_ostream[-3]) &
                           0xffffffb5 | 2;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9,"          in: ",0xe);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[36m",5);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9,"multiple_config_change_test",0x1b);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"()\x1b[0m",6);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9,"          at: ",0xe);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[32m",5);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                 ,0x6a);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m:",5);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;35m",7);
                      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x327);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9,"    value of: \x1b[1;34ms4_conf->get_priority()\x1b[0m\n",
                                 0x31);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9,"    expected: \x1b[1;32m",0x15);
                      poVar9 = (ostream *)std::ostream::operator<<(poVar9,10);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m\n",5);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9,"      actual: \x1b[1;31m",0x15);
                      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar7);
                      configs_out_00 =
                           (vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                            *)0x1a741a;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m\n",5);
                      if ((RaftPkg *)local_688._0_8_ != (RaftPkg *)(local_688 + 0x10)) {
                        operator_delete((void *)local_688._0_8_);
                      }
                      iVar11 = 1;
                      TestSuite::failHandler();
                    }
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_600._8_8_ !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_600._8_8_);
                    }
                    if ((element_type *)local_638._8_8_ != (element_type *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_638._8_8_);
                    }
                  }
                }
                else {
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
                  std::ostream::put(-0x68);
                  poVar9 = (ostream *)std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"        time: ",0xe);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;30m",7);
                  TestSuite::getTimeString_abi_cxx11_();
                  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar9,(char *)local_688._0_8_,local_688._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"      thread: ",0xe);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[33m",5);
                  pp_Var3 = poVar9->_vptr_basic_ostream;
                  *(uint *)(&poVar9->field_0x18 + (long)pp_Var3[-3]) =
                       *(uint *)(&poVar9->field_0x18 + (long)pp_Var3[-3]) & 0xffffffb5 | 8;
                  *(undefined8 *)(&poVar9->field_0x10 + (long)pp_Var3[-3]) = 4;
                  p_Var13 = (_func_int *)((long)&poVar9->_vptr_basic_ostream + (long)pp_Var3[-3]);
                  if ((&poVar9->field_0xe1)[(long)pp_Var3[-3]] == '\0') {
                    cVar6 = (code)std::ios::widen((char)p_Var13);
                    p_Var13[0xe0] = cVar6;
                    p_Var13[0xe1] = (code)0x1;
                  }
                  p_Var13[0xe0] = (code)0x30;
                  local_638._0_8_ = pthread_self();
                  std::_Hash_bytes(local_638,8,0xc70f6907);
                  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                  *(uint *)(&poVar9->field_0x18 + (long)poVar9->_vptr_basic_ostream[-3]) =
                       *(uint *)(&poVar9->field_0x18 + (long)poVar9->_vptr_basic_ostream[-3]) &
                       0xffffffb5 | 2;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"          in: ",0xe);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[36m",5);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar9,"multiple_config_change_test",0x1b);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"()\x1b[0m",6);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"          at: ",0xe);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[32m",5);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar9,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                             ,0x6a);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m:",5);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;35m",7);
                  poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x31c);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar9,"    value of: \x1b[1;34mconfigs_out.size()\x1b[0m\n",0x2c);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar9,"    expected: \x1b[1;32m",0x15);
                  poVar9 = (ostream *)std::ostream::operator<<(poVar9,3);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m\n",5);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar9,"      actual: \x1b[1;31m",0x15);
                  poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar7);
                  configs_out_00 =
                       (vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                        *)0x1a741a;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m\n",5);
                  if ((RaftPkg *)local_688._0_8_ != (RaftPkg *)(local_688 + 0x10)) {
                    operator_delete((void *)local_688._0_8_);
                  }
                  iVar11 = 1;
                  TestSuite::failHandler();
                }
                std::
                vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                ::~vector(&local_668);
              }
              __fd = (int)configs_out_00;
              if ((iVar11 != 3) && (iVar11 != 0)) {
                iVar7 = -1;
                goto LAB_0011fa8f;
              }
              p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&p_Var12->_M_use_count;
            } while (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_610._M_thread)
            ;
          }
          print_stats((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)(local_638 + 0x10));
          nuraft::raft_server::shutdown((raft_server *)local_418,__fd,__how);
          nuraft::raft_server::shutdown
                    (local_178.raftServer.
                     super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,__fd
                     ,__how_00);
          nuraft::raft_server::shutdown((raft_server *)local_2c0._312_8_,__fd,__how_01);
          nuraft::raft_server::shutdown((raft_server *)local_408._312_8_,__fd,__how_02);
          iVar7 = 0;
          nuraft::FakeNetworkBase::destroy
                    (local_648.
                     super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
        }
        else {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
          std::ostream::put(-0x68);
          poVar9 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"        time: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;30m",7);
          TestSuite::getTimeString_abi_cxx11_();
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(char *)local_688._0_8_,local_688._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"      thread: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[33m",5);
          pp_Var3 = poVar9->_vptr_basic_ostream;
          *(uint *)(&poVar9->field_0x18 + (long)pp_Var3[-3]) =
               *(uint *)(&poVar9->field_0x18 + (long)pp_Var3[-3]) & 0xffffffb5 | 8;
          *(undefined8 *)(&poVar9->field_0x10 + (long)pp_Var3[-3]) = 4;
          p_Var13 = (_func_int *)((long)&poVar9->_vptr_basic_ostream + (long)pp_Var3[-3]);
          if ((&poVar9->field_0xe1)[(long)pp_Var3[-3]] == '\0') {
            cVar6 = (code)std::ios::widen((char)p_Var13);
            p_Var13[0xe0] = cVar6;
            p_Var13[0xe1] = (code)0x1;
          }
          p_Var13[0xe0] = (code)0x30;
          local_668.
          super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pthread_self();
          std::_Hash_bytes(&local_668,8,0xc70f6907);
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          *(uint *)(&poVar9->field_0x18 + (long)poVar9->_vptr_basic_ostream[-3]) =
               *(uint *)(&poVar9->field_0x18 + (long)poVar9->_vptr_basic_ostream[-3]) & 0xffffffb5 |
               2;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"          in: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[36m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"multiple_config_change_test",0x1b);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"()\x1b[0m",6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"          at: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[32m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                     ,0x6a);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m:",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;35m",7);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x312);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,
                     "    value of: \x1b[1;34mwait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC)\x1b[0m\n",
                     0x44);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"    expected: \x1b[1;32m",0x15)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"0",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m\n",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"      actual: \x1b[1;31m",0x15)
          ;
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,-1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m\n",5);
          if ((RaftPkg *)local_688._0_8_ != pRVar1) {
            operator_delete((void *)local_688._0_8_);
          }
          iVar7 = -1;
          TestSuite::failHandler();
        }
      }
      else {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
        std::ostream::put(-0x68);
        poVar9 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"        time: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;30m",7);
        TestSuite::getTimeString_abi_cxx11_();
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(char *)local_688._0_8_,local_688._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"      thread: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[33m",5);
        pp_Var3 = poVar9->_vptr_basic_ostream;
        *(uint *)(&poVar9->field_0x18 + (long)pp_Var3[-3]) =
             *(uint *)(&poVar9->field_0x18 + (long)pp_Var3[-3]) & 0xffffffb5 | 8;
        *(undefined8 *)(&poVar9->field_0x10 + (long)pp_Var3[-3]) = 4;
        p_Var13 = (_func_int *)((long)&poVar9->_vptr_basic_ostream + (long)pp_Var3[-3]);
        if ((&poVar9->field_0xe1)[(long)pp_Var3[-3]] == '\0') {
          cVar6 = (code)std::ios::widen((char)p_Var13);
          p_Var13[0xe0] = cVar6;
          p_Var13[0xe1] = (code)0x1;
        }
        p_Var13[0xe0] = (code)0x30;
        local_668.
        super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pthread_self();
        std::_Hash_bytes(&local_668,8,0xc70f6907);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        *(uint *)(&poVar9->field_0x18 + (long)poVar9->_vptr_basic_ostream[-3]) =
             *(uint *)(&poVar9->field_0x18 + (long)poVar9->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"          in: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[36m",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"multiple_config_change_test",0x1b);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"()\x1b[0m",6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"          at: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[32m",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                   ,0x6a);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m:",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;35m",7);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x304);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"    expected: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"\x1b[1;34m0 > ret->get_result_code()\x1b[0m\n",0x26);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"    value of ",0xd);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;32m0\x1b[0m: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;31m",7);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m\n",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"    value of ",0xd);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"\x1b[1;32mret->get_result_code()\x1b[0m: ",0x23);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;31m",7);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,cVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m\n",5);
        if ((RaftPkg *)local_688._0_8_ != (RaftPkg *)(local_688 + 0x10)) {
          operator_delete((void *)local_688._0_8_);
        }
        iVar7 = -1;
        TestSuite::failHandler();
      }
LAB_0011fa8f:
      if ((element_type *)local_5f0._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5f0._8_8_);
      }
    }
    else {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
      std::ostream::put(-0x68);
      poVar9 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"        time: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;30m",7);
      TestSuite::getTimeString_abi_cxx11_();
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(char *)local_688._0_8_,local_688._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"      thread: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[33m",5);
      pp_Var3 = poVar9->_vptr_basic_ostream;
      *(uint *)(&poVar9->field_0x18 + (long)pp_Var3[-3]) =
           *(uint *)(&poVar9->field_0x18 + (long)pp_Var3[-3]) & 0xffffffb5 | 8;
      *(undefined8 *)(&poVar9->field_0x10 + (long)pp_Var3[-3]) = 4;
      p_Var13 = (_func_int *)((long)&poVar9->_vptr_basic_ostream + (long)pp_Var3[-3]);
      if ((&poVar9->field_0xe1)[(long)pp_Var3[-3]] == '\0') {
        cVar6 = (code)std::ios::widen((char)p_Var13);
        p_Var13[0xe0] = cVar6;
        p_Var13[0xe1] = (code)0x1;
      }
      p_Var13[0xe0] = (code)0x30;
      local_668.
      super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pthread_self();
      std::_Hash_bytes(&local_668,8,0xc70f6907);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      *(uint *)(&poVar9->field_0x18 + (long)poVar9->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar9->field_0x18 + (long)poVar9->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"          in: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[36m",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"multiple_config_change_test",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"()\x1b[0m",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"          at: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[32m",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                 ,0x6a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m:",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;35m",7);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x2fc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"    value of: \x1b[1;34mmake_group( pkgs )\x1b[0m\n",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"    expected: \x1b[1;32m",0x15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"0",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m\n",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"      actual: \x1b[1;31m",0x15);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,-1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m\n",5);
      if ((RaftPkg *)local_688._0_8_ != (RaftPkg *)(local_688 + 0x10)) {
        operator_delete((void *)local_688._0_8_);
      }
      iVar7 = -1;
      TestSuite::failHandler();
    }
  }
  else {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    poVar9 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"        time: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;30m",7);
    TestSuite::getTimeString_abi_cxx11_();
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(char *)local_688._0_8_,local_688._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"      thread: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[33m",5);
    pp_Var3 = poVar9->_vptr_basic_ostream;
    *(uint *)(&poVar9->field_0x18 + (long)pp_Var3[-3]) =
         *(uint *)(&poVar9->field_0x18 + (long)pp_Var3[-3]) & 0xffffffb5 | 8;
    *(undefined8 *)(&poVar9->field_0x10 + (long)pp_Var3[-3]) = 4;
    p_Var13 = (_func_int *)((long)&poVar9->_vptr_basic_ostream + (long)pp_Var3[-3]);
    if ((&poVar9->field_0xe1)[(long)pp_Var3[-3]] == '\0') {
      cVar6 = (code)std::ios::widen((char)p_Var13);
      p_Var13[0xe0] = cVar6;
      p_Var13[0xe1] = (code)0x1;
    }
    p_Var13[0xe0] = (code)0x30;
    local_668.
    super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pthread_self();
    std::_Hash_bytes(&local_668,8,0xc70f6907);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    *(uint *)(&poVar9->field_0x18 + (long)poVar9->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar9->field_0x18 + (long)poVar9->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"          in: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[36m",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"multiple_config_change_test",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"()\x1b[0m",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"          at: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[32m",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m:",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;35m",7);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x2fb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"    value of: \x1b[1;34mlaunch_servers( pkgs )\x1b[0m\n",0x30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"    expected: \x1b[1;32m",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"0",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m\n",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"      actual: \x1b[1;31m",0x15);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,-1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[0m\n",5);
    if ((RaftPkg *)local_688._0_8_ != (RaftPkg *)(local_688 + 0x10)) {
      operator_delete((void *)local_688._0_8_);
    }
    iVar7 = -1;
    TestSuite::failHandler();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_638._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete((void *)local_638._16_8_);
  }
  RaftPkg::~RaftPkg((RaftPkg *)local_408);
  RaftPkg::~RaftPkg((RaftPkg *)local_2c0);
  RaftPkg::~RaftPkg(&local_178);
  RaftPkg::~RaftPkg((RaftPkg *)(local_560 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
    operator_delete(local_5e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p);
  }
  if (local_648.super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_648.super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return iVar7;
}

Assistant:

int multiple_config_change_test() {
    reset_log_files();
    ptr<FakeNetworkBase> f_base = cs_new<FakeNetworkBase>();

    std::string s1_addr = "S1";
    std::string s2_addr = "S2";
    std::string s3_addr = "S3";
    std::string s4_addr = "S4";

    RaftPkg s1(f_base, 1, s1_addr);
    RaftPkg s2(f_base, 2, s2_addr);
    RaftPkg s3(f_base, 3, s3_addr);
    RaftPkg s4(f_base, 4, s4_addr);
    std::vector<RaftPkg*> pkgs = {&s1, &s2, &s3, &s4};

    CHK_Z( launch_servers( pkgs ) );
    CHK_Z( make_group( pkgs ) );

    // Remove two nodes without waiting commit.
    s1.raftServer->remove_srv( s3.getTestMgr()->get_srv_config()->get_id() );

    // Cannot remove multiple servers at once, should return error.
    ptr<raft_result> ret =
        s1.raftServer->remove_srv( s4.getTestMgr()->get_srv_config()->get_id() );
    CHK_GT(0, ret->get_result_code());

    // Priority change is OK.
    s1.raftServer->set_priority(s4.getTestMgr()->get_srv_config()->get_id(), 10);

    // Leave req/resp.
    s1.fNet->execReqResp();
    // Leave done, notify to peers.
    s1.fNet->execReqResp();
    // Probably one more.
    s1.fNet->execReqResp();
    // Notify new commit.
    s1.fNet->execReqResp();
    // Wait for bg commit for configuration change.
    CHK_Z( wait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC) );

    // S3 should be removed.
    for (RaftPkg* pp: pkgs) {
        if (pp->getTestMgr()->get_srv_config()->get_id() == 3) continue;

        std::vector< ptr< srv_config > > configs_out;
        pp->raftServer->get_srv_config_all(configs_out);

        // Only S1, S2, and S4 should exist.
        CHK_EQ(3, configs_out.size());
        for (auto& entry: configs_out) {
            ptr<srv_config>& s_conf = entry;
            CHK_TRUE( s_conf->get_id() == 1 ||
                      s_conf->get_id() == 2 ||
                      s_conf->get_id() == 4 );
        }

        // S4's priority should be 10.
        ptr<cluster_config> c_conf = pp->raftServer->get_config();
        ptr<srv_config> s4_conf = c_conf->get_server(4);
        CHK_EQ(10, s4_conf->get_priority());
    }

    print_stats(pkgs);

    s1.raftServer->shutdown();
    s2.raftServer->shutdown();
    s3.raftServer->shutdown();
    s4.raftServer->shutdown();

    f_base->destroy();

    return 0;
}